

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FieldMapTestCase.cpp
# Opt level: O0

void __thiscall
SuiteFieldMapTests::TestsetField_16FieldsAlreadyExist_fieldSet::RunImpl
          (TestsetField_16FieldsAlreadyExist_fieldSet *this)

{
  TestResults *pTVar1;
  TestResults **ppTVar2;
  TestDetails **ppTVar3;
  string *actual;
  TestDetails local_4f8 [2];
  TestDetails local_4b8;
  int local_494 [2];
  allocator<char> local_489;
  string local_488;
  undefined1 local_468 [8];
  FieldBase actualTag18;
  string local_400;
  undefined1 local_3e0 [8];
  FieldBase expectedTag18;
  string local_378;
  allocator<char> local_351;
  string local_350;
  allocator<char> local_329;
  string local_328;
  allocator<char> local_301;
  string local_300;
  allocator<char> local_2d9;
  string local_2d8;
  allocator<char> local_2b1;
  string local_2b0;
  allocator<char> local_289;
  string local_288;
  allocator<char> local_261;
  string local_260;
  allocator<char> local_239;
  string local_238;
  allocator<char> local_211;
  string local_210;
  allocator<char> local_1e9;
  string local_1e8;
  allocator<char> local_1c1;
  string local_1c0;
  allocator<char> local_199;
  string local_198;
  allocator<char> local_171;
  string local_170;
  allocator<char> local_149;
  string local_148;
  allocator<char> local_121;
  string local_120;
  allocator<char> local_f9;
  string local_f8;
  allocator<char> local_d1;
  string local_d0;
  message_order local_a0;
  FieldMap local_80 [8];
  FieldMap fieldMap;
  TestsetField_16FieldsAlreadyExist_fieldSet *this_local;
  
  FIX::message_order::message_order(&local_a0,normal);
  FIX::FieldMap::FieldMap(local_80,&local_a0);
  FIX::message_order::~message_order(&local_a0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_d0,"field1",&local_d1);
  FIX::FieldMap::setField(local_80,1,&local_d0);
  std::__cxx11::string::~string((string *)&local_d0);
  std::allocator<char>::~allocator(&local_d1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_f8,"field2",&local_f9);
  FIX::FieldMap::setField(local_80,2,&local_f8);
  std::__cxx11::string::~string((string *)&local_f8);
  std::allocator<char>::~allocator(&local_f9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_120,"field3",&local_121);
  FIX::FieldMap::setField(local_80,3,&local_120);
  std::__cxx11::string::~string((string *)&local_120);
  std::allocator<char>::~allocator(&local_121);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_148,"field4",&local_149);
  FIX::FieldMap::setField(local_80,4,&local_148);
  std::__cxx11::string::~string((string *)&local_148);
  std::allocator<char>::~allocator(&local_149);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_170,"field5",&local_171);
  FIX::FieldMap::setField(local_80,5,&local_170);
  std::__cxx11::string::~string((string *)&local_170);
  std::allocator<char>::~allocator(&local_171);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_198,"field6",&local_199);
  FIX::FieldMap::setField(local_80,6,&local_198);
  std::__cxx11::string::~string((string *)&local_198);
  std::allocator<char>::~allocator(&local_199);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1c0,"field7",&local_1c1);
  FIX::FieldMap::setField(local_80,7,&local_1c0);
  std::__cxx11::string::~string((string *)&local_1c0);
  std::allocator<char>::~allocator(&local_1c1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1e8,"field8",&local_1e9);
  FIX::FieldMap::setField(local_80,8,&local_1e8);
  std::__cxx11::string::~string((string *)&local_1e8);
  std::allocator<char>::~allocator(&local_1e9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_210,"field9",&local_211);
  FIX::FieldMap::setField(local_80,9,&local_210);
  std::__cxx11::string::~string((string *)&local_210);
  std::allocator<char>::~allocator(&local_211);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_238,"field10",&local_239);
  FIX::FieldMap::setField(local_80,10,&local_238);
  std::__cxx11::string::~string((string *)&local_238);
  std::allocator<char>::~allocator(&local_239);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_260,"field11",&local_261);
  FIX::FieldMap::setField(local_80,0xb,&local_260);
  std::__cxx11::string::~string((string *)&local_260);
  std::allocator<char>::~allocator(&local_261);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_288,"field12",&local_289);
  FIX::FieldMap::setField(local_80,0xc,&local_288);
  std::__cxx11::string::~string((string *)&local_288);
  std::allocator<char>::~allocator(&local_289);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2b0,"field13",&local_2b1);
  FIX::FieldMap::setField(local_80,0xd,&local_2b0);
  std::__cxx11::string::~string((string *)&local_2b0);
  std::allocator<char>::~allocator(&local_2b1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2d8,"field14",&local_2d9);
  FIX::FieldMap::setField(local_80,0xe,&local_2d8);
  std::__cxx11::string::~string((string *)&local_2d8);
  std::allocator<char>::~allocator(&local_2d9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_300,"field15",&local_301);
  FIX::FieldMap::setField(local_80,0xf,&local_300);
  std::__cxx11::string::~string((string *)&local_300);
  std::allocator<char>::~allocator(&local_301);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_328,"field16",&local_329);
  FIX::FieldMap::setField(local_80,0x10,&local_328);
  std::__cxx11::string::~string((string *)&local_328);
  std::allocator<char>::~allocator(&local_329);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_350,"field17",&local_351);
  FIX::FieldMap::setField(local_80,0x11,&local_350);
  std::__cxx11::string::~string((string *)&local_350);
  std::allocator<char>::~allocator(&local_351);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_378,"field18",(allocator<char> *)&expectedTag18.m_metrics.field_0xf);
  FIX::FieldMap::setField(local_80,0x12,&local_378);
  std::__cxx11::string::~string((string *)&local_378);
  std::allocator<char>::~allocator((allocator<char> *)&expectedTag18.m_metrics.field_0xf);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_400,"field18_new",(allocator<char> *)&actualTag18.m_metrics.field_0xf)
  ;
  FIX::FieldBase::FieldBase((FieldBase *)local_3e0,0x12,&local_400);
  std::__cxx11::string::~string((string *)&local_400);
  std::allocator<char>::~allocator((allocator<char> *)&actualTag18.m_metrics.field_0xf);
  FIX::FieldMap::setField(local_80,(FieldBase *)local_3e0,true);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_488,"",&local_489);
  FIX::FieldBase::FieldBase((FieldBase *)local_468,0x12,&local_488);
  std::__cxx11::string::~string((string *)&local_488);
  std::allocator<char>::~allocator(&local_489);
  FIX::FieldMap::getFieldIfSet(local_80,(FieldBase *)local_468);
  ppTVar2 = UnitTest::CurrentTest::Results();
  pTVar1 = *ppTVar2;
  local_494[1] = 0x12;
  local_494[0] = FIX::FieldBase::getTag((FieldBase *)local_468);
  ppTVar3 = UnitTest::CurrentTest::Details();
  UnitTest::TestDetails::TestDetails(&local_4b8,*ppTVar3,0x99);
  UnitTest::CheckEqual<int,int>(pTVar1,local_494 + 1,local_494,&local_4b8);
  ppTVar2 = UnitTest::CurrentTest::Results();
  pTVar1 = *ppTVar2;
  actual = FIX::FieldBase::getString_abi_cxx11_((FieldBase *)local_468);
  ppTVar3 = UnitTest::CurrentTest::Details();
  UnitTest::TestDetails::TestDetails(local_4f8,*ppTVar3,0x9a);
  UnitTest::CheckEqual<char[12],std::__cxx11::string>
            (pTVar1,(char (*) [12])"field18_new",actual,local_4f8);
  FIX::FieldBase::~FieldBase((FieldBase *)local_468);
  FIX::FieldBase::~FieldBase((FieldBase *)local_3e0);
  FIX::FieldMap::~FieldMap(local_80);
  return;
}

Assistant:

TEST(setField_16FieldsAlreadyExist_fieldSet)
{
    FieldMap fieldMap;
    fieldMap.setField(1, "field1");
    fieldMap.setField(2, "field2");
    fieldMap.setField(3, "field3");
    fieldMap.setField(4, "field4");
    fieldMap.setField(5, "field5");
    fieldMap.setField(6, "field6");

    fieldMap.setField(7, "field7");
    fieldMap.setField(8, "field8");
    fieldMap.setField(9, "field9");
    fieldMap.setField(10, "field10");
    fieldMap.setField(11, "field11");
    fieldMap.setField(12, "field12");
    fieldMap.setField(13, "field13");
    fieldMap.setField(14, "field14");
    fieldMap.setField(15, "field15");
    fieldMap.setField(16, "field16");
    fieldMap.setField(17, "field17");
    fieldMap.setField(18, "field18");

    FieldBase expectedTag18(18, "field18_new");

    fieldMap.setField(expectedTag18);

    FieldBase actualTag18(18, "");
    fieldMap.getFieldIfSet(actualTag18);

    CHECK_EQUAL(18, actualTag18.getTag());
    CHECK_EQUAL("field18_new", actualTag18.getString());
}